

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unique_ptr.hpp
# Opt level: O0

void duckdb::unique_ptr<duckdb::DuckDBViewsData,_std::default_delete<duckdb::DuckDBViewsData>,_true>
     ::AssertNotNull(bool null)

{
  byte in_DIL;
  string *in_stack_ffffffffffffffa8;
  InternalException *this;
  allocator local_29;
  string local_28 [39];
  byte local_1;
  
  local_1 = in_DIL & 1;
  if (local_1 != 0) {
    this = (InternalException *)__cxa_allocate_exception(0x10);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              (local_28,"Attempted to dereference unique_ptr that is NULL!",&local_29);
    InternalException::InternalException(this,in_stack_ffffffffffffffa8);
    __cxa_throw(this,&InternalException::typeinfo,InternalException::~InternalException);
  }
  return;
}

Assistant:

static inline void AssertNotNull(const bool null) {
#if defined(DUCKDB_DEBUG_NO_SAFETY) || defined(DUCKDB_CLANG_TIDY)
		return;
#else
		if (DUCKDB_UNLIKELY(null)) {
			throw duckdb::InternalException("Attempted to dereference unique_ptr that is NULL!");
		}
#endif
	}